

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

spv_result_t
spvOperandTableNameLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,char *name,
          size_t nameLength,spv_operand_desc *pEntry)

{
  spv_operand_desc_t *psVar1;
  uint uVar2;
  uint uVar3;
  spv_operand_desc_group_t *psVar4;
  char *pcVar5;
  char **ppcVar6;
  int iVar7;
  uint uVar8;
  spv_result_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  
  if (table == (spv_operand_table)0x0) {
    sVar9 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    sVar9 = SPV_ERROR_INVALID_POINTER;
    if (pEntry != (spv_operand_desc *)0x0 && name != (char *)0x0) {
      uVar2 = table->count;
      if ((ulong)uVar2 == 0) {
        sVar9 = SPV_ERROR_INVALID_LOOKUP;
      }
      else {
        uVar11 = 0;
        do {
          psVar4 = table->types;
          uVar8 = 4;
          if (psVar4[uVar11].type == type) {
            uVar3 = psVar4[uVar11].count;
            if ((ulong)uVar3 != 0) {
              uVar13 = 0;
              do {
                psVar1 = psVar4[uVar11].entries + uVar13;
                pcVar5 = psVar4[uVar11].entries[uVar13].name;
                sVar10 = strlen(pcVar5);
                if (sVar10 == nameLength) {
                  iVar7 = strncmp(pcVar5,name,nameLength);
                  if (iVar7 != 0) goto LAB_0062dc66;
                  *pEntry = psVar1;
                  uVar8 = 1;
                }
                else {
LAB_0062dc66:
                  uVar12 = (ulong)psVar1->numAliases;
                  if (uVar12 != 0) {
                    ppcVar6 = psVar1->aliases;
                    bVar15 = true;
                    uVar14 = 1;
                    do {
                      pcVar5 = ppcVar6[uVar14 - 1];
                      sVar10 = strlen(pcVar5);
                      if (sVar10 == nameLength) {
                        iVar7 = strncmp(name,pcVar5,nameLength);
                        if (iVar7 == 0) {
                          *pEntry = psVar1;
                          uVar8 = 1;
                          goto LAB_0062dcf9;
                        }
                      }
                      bVar15 = uVar14 < uVar12;
                      bVar16 = uVar14 != uVar12;
                      uVar14 = uVar14 + 1;
                    } while (bVar16);
                    uVar8 = 8;
LAB_0062dcf9:
                    if (bVar15) goto LAB_0062dd15;
                  }
                  uVar8 = 0;
                }
LAB_0062dd15:
                if (uVar8 != 0) goto LAB_0062dd2a;
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar3);
            }
            uVar8 = 5;
LAB_0062dd2a:
            if (uVar8 == 5) {
              uVar8 = 0;
            }
          }
          if ((uVar8 & 0xb) != 0) goto LAB_0062dd51;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
        uVar8 = 2;
LAB_0062dd51:
        sVar9 = (uint)(uVar8 != 2) * 9 + SPV_ERROR_INVALID_LOOKUP;
      }
    }
  }
  return sVar9;
}

Assistant:

spv_result_t spvOperandTableNameLookup(spv_target_env,
                                       const spv_operand_table table,
                                       const spv_operand_type_t type,
                                       const char* name,
                                       const size_t nameLength,
                                       spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;
    for (uint64_t index = 0; index < group.count; ++index) {
      const auto& entry = group.entries[index];
      // We consider the current operand as available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      //
      // Exact match case
      if (nameLength == strlen(entry.name) &&
          !strncmp(entry.name, name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }

      // Check the aliases. Ideally we would have a version of the table sorted
      // by name and then we could iterate between the lower and upper bounds to
      // restrict the amount comparisons. Fortunately, name-based lookups are
      // mostly restricted to the assembler.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          const auto alias = entry.aliases[aliasIndex];
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}